

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2LoadLabel(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint64_t uVar3;
  uint64_t Address_00;
  uint Op;
  uint uVar4;
  
  uVar4 = Insn >> 0xc & 0xf;
  uVar3 = ARM_getFeatureBits(Inst->csh->mode);
  if (uVar4 == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    Op = 0x9b9;
    if ((uVar1 == 0x94f) || (uVar1 == 0x95e)) {
LAB_001cae87:
      MCInst_setOpcode(Inst,Op);
      goto LAB_001cae8f;
    }
    if (uVar1 != 0x96e) {
      if (uVar1 != 0x966) goto LAB_001cae8f;
      Op = 0x9bd;
      goto LAB_001cae87;
    }
    goto LAB_001caeb0;
  }
LAB_001cae8f:
  uVar1 = MCInst_getOpcode(Inst);
  DVar2 = MCDisassembler_Success;
  if (uVar1 == 0x9b9) {
LAB_001caecb:
    uVar1 = Insn & 0xfff;
    uVar4 = 0x80000000;
    if (uVar1 != 0) {
      uVar4 = -uVar1;
    }
    if ((Insn >> 0x17 & 1) != 0) {
      uVar4 = uVar1;
    }
    MCOperand_CreateImm0(Inst,(long)(int)uVar4);
  }
  else {
    if (uVar1 == 0x9bd) {
      if ((uVar3 >> 0x28 & 1) != 0) goto LAB_001caecb;
    }
    else {
      DVar2 = DecodeGPRRegisterClass(Inst,uVar4,Address_00,Decoder);
      if ((DVar2 | 2) == MCDisassembler_Success) goto LAB_001caecb;
    }
LAB_001caeb0:
    DVar2 = MCDisassembler_Fail;
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeT2LoadLabel(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);
	int imm = fieldFromInstruction_4(Insn, 0, 12);
	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRBpci:
			case ARM_t2LDRHpci:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2LDRSBpci:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			case ARM_t2LDRSHpci:
				return MCDisassembler_Fail;
			default:
				break;
		}
	}

	switch(MCInst_getOpcode(Inst)) {
		case ARM_t2PLDpci:
			break;
		case ARM_t2PLIpci:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!U) {
		// Special case for #-0.
		if (imm == 0)
			imm = INT32_MIN;
		else
			imm = -imm;
	}
	MCOperand_CreateImm0(Inst, imm);

	return S;
}